

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void duckdb::QuantileScalarOperation<false,duckdb::QuantileStandardType>::
     Window<duckdb::QuantileState<double,duckdb::QuantileStandardType>,double,double>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t ridx)

{
  bool bVar1;
  CursorType *dmask_p;
  idx_t iVar2;
  double *pdVar3;
  TemplatedValidityMask<unsigned_long> *this;
  WindowQuantileState<double> *this_00;
  QuantileIncluded<double> *in_RDX;
  SubFrames *in_RSI;
  CursorType *in_RDI;
  double dVar4;
  WindowQuantileState<double> *unaff_retaddr;
  WindowQuantileState<double> *window_state;
  value_type *quantile;
  ValidityMask *rmask;
  double *rdata;
  QuantileBindData *bind_data;
  idx_t n;
  QuantileIncluded<double> included;
  ValidityMask *fmask;
  CursorType *data;
  QuantileState<double,_duckdb::QuantileStandardType> *gstate;
  QuantileState<double,_duckdb::QuantileStandardType> *state;
  vector<duckdb::FrameBounds,_true> *in_stack_ffffffffffffff68;
  QuantileState<double,_duckdb::QuantileStandardType> *in_stack_ffffffffffffff70;
  WindowPartitionInput *in_stack_ffffffffffffff78;
  QuantileState<double,_duckdb::QuantileStandardType> *in_stack_ffffffffffffff80;
  QuantileIncluded<double> local_60;
  pointer local_50;
  QuantileIncluded<double> *included_00;
  
  included_00 = in_RDX;
  dmask_p = QuantileState<double,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_50 = in_RSI[3].super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  QuantileIncluded<double>::QuantileIncluded(&local_60,(ValidityMask *)local_50,dmask_p);
  iVar2 = QuantileOperation::FrameSize<double>(in_RDX,(SubFrames *)dmask_p);
  optional_ptr<duckdb::FunctionData,_true>::operator->
            ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffff70);
  FunctionData::Cast<duckdb::QuantileBindData>((FunctionData *)in_stack_ffffffffffffff70);
  pdVar3 = FlatVector::GetData<double>((Vector *)0x1d64541);
  this = &FlatVector::Validity((Vector *)0x1d64550)->super_TemplatedValidityMask<unsigned_long>;
  if (iVar2 == 0) {
    TemplatedValidityMask<unsigned_long>::Set
              (this,(idx_t)in_stack_ffffffffffffff78,
               SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0));
  }
  else {
    vector<duckdb::QuantileValue,_true>::operator[]
              ((vector<duckdb::QuantileValue,_true> *)in_stack_ffffffffffffff70,
               (size_type)in_stack_ffffffffffffff68);
    if ((in_RDX == (QuantileIncluded<double> *)0x0) ||
       (bVar1 = QuantileState<double,_duckdb::QuantileStandardType>::HasTree
                          (in_stack_ffffffffffffff70), !bVar1)) {
      this_00 = QuantileState<double,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                          (in_stack_ffffffffffffff70);
      WindowQuantileState<double>::UpdateSkip(unaff_retaddr,in_RDI,in_RSI,included_00);
      dVar4 = WindowQuantileState<double>::WindowScalar<double,false>
                        ((WindowQuantileState<double> *)partition,(CursorType *)g_state,
                         (SubFrames *)l_state,(idx_t)frames,result,(QuantileValue *)state);
      pdVar3[(long)window_state] = dVar4;
      vector<duckdb::FrameBounds,_true>::operator=
                ((vector<duckdb::FrameBounds,_true> *)this_00,in_stack_ffffffffffffff68);
    }
    else {
      QuantileState<double,_duckdb::QuantileStandardType>::GetWindowState
                ((QuantileState<double,_duckdb::QuantileStandardType> *)0x1d645af);
      dVar4 = WindowQuantileState<double>::WindowScalar<double,false>
                        ((WindowQuantileState<double> *)partition,(CursorType *)g_state,
                         (SubFrames *)l_state,(idx_t)frames,result,(QuantileValue *)state);
      pdVar3[(long)window_state] = dVar4;
    }
  }
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t ridx) {
		auto &state = *reinterpret_cast<STATE *>(l_state);
		auto gstate = reinterpret_cast<const STATE *>(g_state);

		auto &data = state.GetOrCreateWindowCursor(partition);
		const auto &fmask = partition.filter_mask;

		QuantileIncluded<INPUT_TYPE> included(fmask, data);
		const auto n = FrameSize(included, frames);

		D_ASSERT(aggr_input_data.bind_data);
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
		auto &rmask = FlatVector::Validity(result);

		if (!n) {
			rmask.Set(ridx, false);
			return;
		}

		const auto &quantile = bind_data.quantiles[0];
		if (gstate && gstate->HasTree()) {
			rdata[ridx] = gstate->GetWindowState().template WindowScalar<RESULT_TYPE, DISCRETE>(data, frames, n, result,
			                                                                                    quantile);
		} else {
			auto &window_state = state.GetOrCreateWindowState();

			//	Update the skip list
			window_state.UpdateSkip(data, frames, included);

			// Find the position(s) needed
			rdata[ridx] = window_state.template WindowScalar<RESULT_TYPE, DISCRETE>(data, frames, n, result, quantile);

			//	Save the previous state for next time
			window_state.prevs = frames;
		}
	}